

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

DSA * DSA_new(void)

{
  DSA *pDVar1;
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  
  pDVar1 = (DSA *)OPENSSL_zalloc(0x80);
  if (pDVar1 != (DSA *)0x0) {
    (pDVar1->ex_data).dummy = 1;
    CRYPTO_MUTEX_init((CRYPTO_MUTEX *)&pDVar1->g);
    CRYPTO_new_ex_data((int)pDVar1 + 0x78,in_RSI,ad);
  }
  return pDVar1;
}

Assistant:

DSA *DSA_new(void) {
  DSA *dsa = reinterpret_cast<DSA *>(OPENSSL_zalloc(sizeof(DSA)));
  if (dsa == NULL) {
    return NULL;
  }

  dsa->references = 1;
  CRYPTO_MUTEX_init(&dsa->method_mont_lock);
  CRYPTO_new_ex_data(&dsa->ex_data);
  return dsa;
}